

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

int __thiscall cmXMLParser::CleanupParser(cmXMLParser *this)

{
  XML_Status XVar1;
  uint uVar2;
  bool bVar3;
  
  if ((XML_Parser)this->Parser == (XML_Parser)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Parser not initialized",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    this->ParseError = 1;
    uVar2 = 0;
  }
  else {
    bVar3 = this->ParseError == 0;
    uVar2 = (uint)bVar3;
    if (bVar3) {
      XVar1 = XML_Parse((XML_Parser)this->Parser,"",0,1);
      uVar2 = 1;
      if (XVar1 == XML_STATUS_ERROR) {
        (*this->_vptr_cmXMLParser[0xb])(this);
        uVar2 = 0;
      }
    }
    XML_ParserFree((XML_Parser)this->Parser);
    this->Parser = (void *)0x0;
  }
  return uVar2;
}

Assistant:

int cmXMLParser::CleanupParser()
{
  if (!this->Parser) {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }
  int result = !this->ParseError;
  if (result) {
    // Tell the expat XML parser about the end-of-input.
    if (!XML_Parse(static_cast<XML_Parser>(this->Parser), "", 0, 1)) {
      this->ReportXmlParseError();
      result = 0;
    }
  }

  // Clean up the parser.
  XML_ParserFree(static_cast<XML_Parser>(this->Parser));
  this->Parser = CM_NULLPTR;

  return result;
}